

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::EmitObject
               (SnapObject *snpObject,FileWriter *writer,Separator separator,
               SnapObjectVTable *vtable,ThreadContext *threadContext)

{
  SnapHandler *pSVar1;
  bool bVar2;
  _func_int **pp_Var3;
  undefined7 in_register_00000011;
  uint32 i_1;
  byte bVar4;
  uint32 i;
  ulong uVar5;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  (*writer->_vptr_FileWriter[8])(writer,1);
  FileWriter::WriteAddr(writer,objectId,snpObject->ObjectPtrId,NoSeparator);
  FileWriter::WriteTag<TTD::NSSnapObjects::SnapObjectType>
            (writer,objectType,snpObject->SnapObjectTag,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])
            (writer,0x19,(ulong)(snpObject->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0),1);
  if (snpObject->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0) {
    FileWriter::WriteWellKnownToken
              (writer,wellKnownToken,snpObject->OptWellKnownToken,CommaSeparator);
  }
  FileWriter::WriteAddr(writer,typeId,snpObject->SnapType->TypePtrId,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,0x1b,(ulong)(snpObject->IsCrossSite != 0),1);
  (*writer->_vptr_FileWriter[0xc])
            (writer,0x4d,(ulong)(snpObject->OptDependsOnInfo != (DependsOnInfo *)0x0),1);
  if (snpObject->OptDependsOnInfo != (DependsOnInfo *)0x0) {
    FileWriter::WriteLengthValue(writer,snpObject->OptDependsOnInfo->DepOnCount,CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    uVar5 = 0;
    while( true ) {
      if (snpObject->OptDependsOnInfo->DepOnCount <= uVar5) break;
      (*writer->_vptr_FileWriter[0x12])
                (writer,snpObject->OptDependsOnInfo->DepOnPtrArray[uVar5],(ulong)(uVar5 != 0));
      uVar5 = uVar5 + 1;
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
  }
  bVar2 = Js::DynamicType::Is(snpObject->SnapType->JsTypeId);
  if (bVar2) {
    pSVar1 = snpObject->SnapType->TypeHandlerInfo;
    FileWriter::WriteAddr(writer,objectId,snpObject->OptIndexedObjectArray,CommaSeparator);
    if (pSVar1->MaxPropertyIndex == 0) {
      FileWriter::WriteLengthValue(writer,snpObject->VarArrayCount,CommaSeparator);
    }
    else {
      FileWriter::WriteLengthValue(writer,pSVar1->MaxPropertyIndex,CommaAndBigSpaceSeparator);
      FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
      (*writer->_vptr_FileWriter[8])(writer,1);
      for (uVar5 = 0; uVar5 < pSVar1->MaxPropertyIndex; uVar5 = uVar5 + 1) {
        bVar4 = uVar5 == 0 ^ 3;
        if (pSVar1->PropertyInfoArray[uVar5].DataKind == Clear) {
          pp_Var3 = writer->_vptr_FileWriter + 10;
        }
        else {
          (*writer->_vptr_FileWriter[6])(writer,(ulong)bVar4);
          bVar4 = 0;
          FileWriter::WriteUInt32
                    (writer,pid,pSVar1->PropertyInfoArray[uVar5].PropertyRecordId,NoSeparator);
          (*writer->_vptr_FileWriter[3])(writer,3,1);
          NSSnapValues::EmitTTDVar(snpObject->VarArray[uVar5],writer,NoSeparator);
          pp_Var3 = writer->_vptr_FileWriter + 7;
        }
        (**pp_Var3)(writer,(ulong)bVar4);
      }
      (*writer->_vptr_FileWriter[8])(writer,0xffffffffffffffff);
      (*writer->_vptr_FileWriter[5])(writer,2);
    }
  }
  if (vtable[snpObject->SnapObjectTag].EmitAddtlInfoFunc != (fPtr_EmitAddtlInfo)0x0) {
    (*vtable[snpObject->SnapObjectTag].EmitAddtlInfoFunc)(snpObject,writer);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffffffffffff);
  (*writer->_vptr_FileWriter[7])(writer,2);
  return;
}

Assistant:

void EmitObject(const SnapObject* snpObject, FileWriter* writer, NSTokens::Separator separator, const SnapObjectVTable* vtable, ThreadContext* threadContext)
        {
            writer->WriteRecordStart(separator);
            writer->AdjustIndent(1);

            writer->WriteAddr(NSTokens::Key::objectId, snpObject->ObjectPtrId);
            writer->WriteTag<SnapObjectType>(NSTokens::Key::objectType, snpObject->SnapObjectTag, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::isWellKnownToken, snpObject->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN, NSTokens::Separator::CommaSeparator);
            if(snpObject->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
            {
                writer->WriteWellKnownToken(NSTokens::Key::wellKnownToken, snpObject->OptWellKnownToken, NSTokens::Separator::CommaSeparator);
            }

            writer->WriteAddr(NSTokens::Key::typeId, snpObject->SnapType->TypePtrId, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::isCrossSite, !!snpObject->IsCrossSite, NSTokens::Separator::CommaSeparator);

#if ENABLE_OBJECT_SOURCE_TRACKING
            writer->WriteKey(NSTokens::Key::originInfo, NSTokens::Separator::CommaSeparator);
            EmitDiagnosticOriginInformation(snpObject->DiagOriginInfo, writer, NSTokens::Separator::NoSeparator);
#endif

            writer->WriteBool(NSTokens::Key::isDepOn, snpObject->OptDependsOnInfo != nullptr, NSTokens::Separator::CommaSeparator);
            if(snpObject->OptDependsOnInfo != nullptr)
            {
                writer->WriteLengthValue(snpObject->OptDependsOnInfo->DepOnCount, NSTokens::Separator::CommaSeparator);
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < snpObject->OptDependsOnInfo->DepOnCount; ++i)
                {
                    writer->WriteNakedAddr(snpObject->OptDependsOnInfo->DepOnPtrArray[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
                }
                writer->WriteSequenceEnd();
            }

            if(Js::DynamicType::Is(snpObject->SnapType->JsTypeId))
            {
                const NSSnapType::SnapHandler* handler = snpObject->SnapType->TypeHandlerInfo;

                writer->WriteAddr(NSTokens::Key::objectId, snpObject->OptIndexedObjectArray, NSTokens::Separator::CommaSeparator);

                if(handler->MaxPropertyIndex == 0)
                {
                    writer->WriteLengthValue(snpObject->VarArrayCount, NSTokens::Separator::CommaSeparator);
                }
                else
                {
                    writer->WriteLengthValue(handler->MaxPropertyIndex, NSTokens::Separator::CommaAndBigSpaceSeparator);
                    writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                    writer->AdjustIndent(1);
                    for(uint32 i = 0; i < handler->MaxPropertyIndex; ++i)
                    {
                        NSTokens::Separator varSep = i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator;

                        if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Clear)
                        {
                            writer->WriteNakedNull(varSep);
                        }
                        else
                        {
#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                            writer->WriteRecordStart(varSep);
                            writer->WriteUInt32(NSTokens::Key::pid, (uint32)handler->PropertyInfoArray[i].PropertyRecordId, NSTokens::Separator::NoSeparator);
                            writer->WriteKey(NSTokens::Key::entry, NSTokens::Separator::CommaSeparator);

                            varSep = NSTokens::Separator::NoSeparator;
#endif

                            NSSnapValues::EmitTTDVar(snpObject->VarArray[i], writer, varSep);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                            writer->WriteRecordEnd();
#endif
                        }
                    }
                    writer->AdjustIndent(-1);
                    writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
                }
            }

            fPtr_EmitAddtlInfo addtlInfoEmit = vtable[(uint32)snpObject->SnapObjectTag].EmitAddtlInfoFunc;
            if(addtlInfoEmit != nullptr)
            {
                addtlInfoEmit(snpObject, writer);
            }

            writer->AdjustIndent(-1);
            writer->WriteRecordEnd(NSTokens::Separator::BigSpaceSeparator);
        }